

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void rgba_5551_to_argb_1555
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint16_t *puVar1;
  uint16_t *dst_end;
  int dst_gap;
  int src_gap;
  uint16_t *dst_ptr;
  uint16_t *src_ptr;
  int y;
  int sy_local;
  int sx_local;
  int dst_pitch_local;
  void *dst_local;
  int src_pitch_local;
  void *src_local;
  
  src_ptr = (uint16_t *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  dst_ptr = (uint16_t *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
  for (y = 0; y < height; y = y + 1) {
    puVar1 = dst_ptr + width;
    for (; dst_ptr < puVar1; dst_ptr = dst_ptr + 1) {
      *dst_ptr = *src_ptr << 0xf | (ushort)((int)(*src_ptr & 0xfffe) >> 1);
      src_ptr = src_ptr + 1;
    }
    src_ptr = src_ptr + (src_pitch / 2 - width);
    dst_ptr = dst_ptr + (dst_pitch / 2 - width);
  }
  return;
}

Assistant:

static void rgba_5551_to_argb_1555(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_5551_TO_ARGB_1555(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}